

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

int mcpl_seek(mcpl_file_t ff,uint64_t ipos)

{
  ulong uVar1;
  uint64_t uVar2;
  int iVar3;
  long lVar4;
  uint64_t uVar5;
  long lVar6;
  bool bVar7;
  
  uVar1 = *(ulong *)((long)ff.internal + 0x40);
  uVar2 = *(uint64_t *)((long)ff.internal + 0x88);
  uVar5 = ipos;
  if (uVar1 < ipos) {
    uVar5 = uVar1;
  }
  *(uint64_t *)((long)ff.internal + 0x88) = uVar5;
  if ((ipos < uVar1) && (uVar2 != ipos)) {
    if (*(long *)((long)ff.internal + 8) == 0) {
      iVar3 = fseek(*ff.internal,
                    *(uint *)((long)ff.internal + 0x78) * ipos + *(long *)((long)ff.internal + 0x80)
                    ,0);
      bVar7 = iVar3 == 0;
    }
    else {
      lVar6 = uVar5 * *(uint *)((long)ff.internal + 0x78) + *(long *)((long)ff.internal + 0x80);
      lVar4 = gzseek64(*(long *)((long)ff.internal + 8),lVar6,0);
      bVar7 = lVar4 == lVar6;
    }
    if (!bVar7) {
      (*mcpl_error_handler)("Errors encountered while seeking in particle list");
      printf("MCPL ERROR: %s\n",
             "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!"
            );
      exit(1);
    }
  }
  return (int)(ipos < uVar1);
}

Assistant:

int mcpl_seek(mcpl_file_t ff,uint64_t ipos)
{
  MCPLIMP_FILEDECODE;
  int already_there = (f->current_particle_idx==ipos);
  f->current_particle_idx = (ipos<f->nparticles?ipos:f->nparticles);
  int notEOF = f->current_particle_idx<f->nparticles;
  if (notEOF&&!already_there) {
    int error;
    if (f->filegz) {
      int64_t targetpos = f->current_particle_idx*f->particle_size+f->first_particle_pos;
      error = ! mcpl_gzseek( f->filegz, targetpos );
    } else {
      error = MCPL_FSEEK( f->file, f->first_particle_pos + f->particle_size * ipos )!=0;
    }
    if (error)
      mcpl_error("Errors encountered while seeking in particle list");
  }
  return notEOF;
}